

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_DateTimeStruct * UA_DateTime_toStruct(UA_DateTimeStruct *__return_storage_ptr__,UA_DateTime t)

{
  undefined1 auStack_58 [8];
  tm ts;
  
  __return_storage_ptr__->nanoSec = (short)(t % 10) * 100;
  __return_storage_ptr__->microSec = (short)(t % 10000) / 10;
  __return_storage_ptr__->milliSec =
       (UA_UInt16)
       ((long)((ulong)(uint)((int)(t % 10000000) >> 0x1f) << 0x20 | t % 10000000 & 0xffffffffU) /
       10000);
  ts.tm_wday = 0;
  ts.tm_yday = 0;
  ts.tm_isdst = 0;
  ts._36_4_ = 0;
  ts.tm_hour = 0;
  ts.tm_mday = 0;
  ts.tm_mon = 0;
  ts.tm_year = 0;
  auStack_58._0_4_ = 0;
  auStack_58._4_4_ = 0;
  ts.tm_sec = 0;
  ts.tm_min = 0;
  ts.tm_gmtoff = 0;
  __secs_to_tm((t + -0x19db1ded53e8000) / 10000000,(tm *)auStack_58);
  __return_storage_ptr__->sec = auStack_58._0_2_;
  __return_storage_ptr__->min = auStack_58._4_2_;
  __return_storage_ptr__->hour = (UA_UInt16)ts.tm_sec;
  __return_storage_ptr__->day = (UA_UInt16)ts.tm_min;
  __return_storage_ptr__->month = (short)ts.tm_hour + 1;
  __return_storage_ptr__->year = (short)ts.tm_mday + 0x76c;
  return __return_storage_ptr__;
}

Assistant:

UA_DateTimeStruct
UA_DateTime_toStruct(UA_DateTime t) {
    /* Calculating the the milli-, micro- and nanoseconds */
    UA_DateTimeStruct dateTimeStruct;
    dateTimeStruct.nanoSec  = (UA_UInt16)((t % 10) * 100);
    dateTimeStruct.microSec = (UA_UInt16)((t % 10000) / 10);
    dateTimeStruct.milliSec = (UA_UInt16)((t % 10000000) / 10000);

    /* Calculating the unix time with #include <time.h> */
    time_t secSinceUnixEpoch =
        (time_t)((t - UA_DATETIME_UNIX_EPOCH) / UA_SEC_TO_DATETIME);
    struct tm ts;
    memset(&ts, 0, sizeof(struct tm));
    __secs_to_tm(secSinceUnixEpoch, &ts);
    dateTimeStruct.sec    = (UA_UInt16)ts.tm_sec;
    dateTimeStruct.min    = (UA_UInt16)ts.tm_min;
    dateTimeStruct.hour   = (UA_UInt16)ts.tm_hour;
    dateTimeStruct.day    = (UA_UInt16)ts.tm_mday;
    dateTimeStruct.month  = (UA_UInt16)(ts.tm_mon + 1);
    dateTimeStruct.year   = (UA_UInt16)(ts.tm_year + 1900);
    return dateTimeStruct;
}